

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O0

Var __thiscall Js::ScopeSlots::Get(ScopeSlots *this,uint i)

{
  code *pcVar1;
  bool bVar2;
  size_t sVar3;
  undefined4 *puVar4;
  WriteBarrierPtr<void> **ppWVar5;
  void **ppvVar6;
  uint i_local;
  ScopeSlots *this_local;
  
  sVar3 = GetCount(this);
  if (sVar3 <= i) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0xdc6,"(i < GetCount())","i < GetCount()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ppWVar5 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__((WriteBarrierPtr *)this);
  ppvVar6 = Memory::WriteBarrierPtr::operator_cast_to_void__
                      ((WriteBarrierPtr *)(*ppWVar5 + (i + 2)));
  return *ppvVar6;
}

Assistant:

Var Get(uint i) const
        {
            Assert(i < GetCount());
            return slotArray[i + FirstSlotIndex];
        }